

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (RangeSelectSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  Type *this;
  bool bVar1;
  int iVar2;
  optional<int> oVar3;
  undefined4 extraout_var;
  Diagnostic *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar4;
  _Storage<int,_true> _Var5;
  SourceRange SVar6;
  SequenceRange SVar7;
  SequenceRange range;
  _Storage<int,_true> local_48;
  _Storage<int,_true> _Stack_44;
  undefined1 uStack_40;
  long local_38;
  
  local_48._M_value = 1;
  uStack_40 = 0;
  oVar3 = ASTContext::evalInteger(context,(syntax->left).ptr,(bitmask<slang::ast::ASTFlags>)0x80000)
  ;
  SVar6 = slang::syntax::SyntaxNode::sourceRange(&((syntax->left).ptr)->super_SyntaxNode);
  bVar1 = ASTContext::requirePositive(context,oVar3,SVar6);
  _Var5._M_value =
       oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload;
  if (bVar1) {
    local_48._M_value = _Var5._M_value;
  }
  iVar2 = Expression::bind((int)(syntax->right).ptr,(sockaddr *)context,
                           (uint)allowUnbounded << 9 | 0x90000);
  this = (((Expression *)CONCAT44(extraout_var,iVar2))->type).ptr;
  uVar4 = extraout_RDX;
  if (this->canonical == (Type *)0x0) {
    Type::resolveCanonical(this);
    uVar4 = extraout_RDX_00;
  }
  if ((this->canonical->super_Symbol).kind != UnboundedType) {
    oVar3 = ASTContext::evalInteger
                      (context,(Expression *)CONCAT44(extraout_var,iVar2),
                       (bitmask<slang::ast::EvalFlags>)0x0);
    SVar6 = slang::syntax::SyntaxNode::sourceRange(&((syntax->right).ptr)->super_SyntaxNode);
    bVar1 = ASTContext::requirePositive(context,oVar3,SVar6);
    uVar4 = extraout_RDX_01;
    if (bVar1) {
      _Stack_44._M_value =
           oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      uStack_40 = 1;
      if (_Stack_44._M_value < _Var5._M_value) {
        SVar6 = slang::syntax::SyntaxNode::sourceRange(&((syntax->left).ptr)->super_SyntaxNode);
        this_00 = ASTContext::addDiag(context,(DiagCode)0x460008,SVar6);
        SVar6 = slang::syntax::SyntaxNode::sourceRange(&((syntax->right).ptr)->super_SyntaxNode);
        Diagnostic::operator<<(this_00,SVar6);
        local_38 = (long)_Var5._M_value;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&this_00->args,&local_38);
        local_38 = (long)_Stack_44._M_value;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&this_00->args,&local_38);
        uVar4 = extraout_RDX_02;
      }
    }
  }
  SVar7.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload =
       (_Storage<unsigned_int,_true>)_Stack_44._M_value;
  SVar7.min = local_48._M_value;
  SVar7.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ =
       (undefined4)CONCAT71((int7)((ulong)uVar4 >> 8),uStack_40);
  return SVar7;
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const RangeSelectSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    SequenceRange range;
    auto l = context.evalInteger(*syntax.left, ASTFlags::AssertionDelayOrRepetition);
    if (context.requirePositive(l, syntax.left->sourceRange()))
        range.min = uint32_t(*l);

    // The rhs can be an unbounded '$' so we need extra AST flags.
    bitmask<ASTFlags> flags = ASTFlags::AssertionExpr | ASTFlags::AssertionDelayOrRepetition;
    if (allowUnbounded)
        flags |= ASTFlags::AllowUnboundedLiteral;

    auto& re = Expression::bind(*syntax.right, context, flags);
    if (re.type->isUnbounded())
        return range;

    auto r = context.evalInteger(re);
    if (context.requirePositive(r, syntax.right->sourceRange())) {
        range.max = uint32_t(*r);
        if (*l > *r) {
            auto& diag = context.addDiag(diag::SeqRangeMinMax, syntax.left->sourceRange());
            diag << syntax.right->sourceRange();
            diag << *l << *r;
        }
    }

    return range;
}